

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewExprStart(LocationUpdater *this,BinaryLocation oldAddr)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false>
  _Stack_38;
  BinaryLocation newAddr;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false>
  local_30;
  const_iterator iter;
  Expression *expr;
  BinaryLocation oldAddr_local;
  LocationUpdater *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false>
            )AddrExprMap::getStart(&this->oldExprAddrMap,oldAddr);
  if (iter.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false>
      ._M_cur != (__node_type *)0x0) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_wasm::BinaryLocations::Span,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>_>
         ::find(&this->newLocations->expressions,(key_type *)&iter);
    _Stack_38._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_wasm::BinaryLocations::Span,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>_>
         ::end(&this->newLocations->expressions);
    bVar1 = std::__detail::operator!=(&local_30,&stack0xffffffffffffffc8);
    if (bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false,_false>
                             *)&local_30);
      return (pvVar2->second).start;
    }
  }
  return 0;
}

Assistant:

BinaryLocation getNewExprStart(BinaryLocation oldAddr) const {
    if (auto* expr = oldExprAddrMap.getStart(oldAddr)) {
      auto iter = newLocations.expressions.find(expr);
      if (iter != newLocations.expressions.end()) {
        BinaryLocation newAddr = iter->second.start;
        return newAddr;
      }
    }
    return 0;
  }